

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

void __thiscall HashMap<String,_Variant>::~HashMap(HashMap<String,_Variant> *this)

{
  Item *this_00;
  ItemBlock *pIVar1;
  ItemBlock *pIVar2;
  Iterator *pIVar3;
  
  if (this->data != (Item **)0x0) {
    operator_delete__(this->data);
  }
  pIVar3 = &this->_begin;
  while (this_00 = pIVar3->item, this_00 != &this->endItem) {
    Item::~Item(this_00);
    pIVar3 = (Iterator *)&this_00->next;
  }
  pIVar2 = this->blocks;
  while (pIVar2 != (ItemBlock *)0x0) {
    pIVar1 = pIVar2->next;
    operator_delete__(pIVar2);
    pIVar2 = pIVar1;
  }
  Item::~Item(&this->endItem);
  return;
}

Assistant:

~HashMap()
  {
    delete[] (char*)data;
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
      i->~Item();
    for(ItemBlock* i = blocks, * next; i; i = next)
    {
      next = i->next;
      delete[] (char*)i;
    }
  }